

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

Error asmjit::Logging::formatLabel
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t labelId)

{
  CodeHolder *pCVar1;
  ulong uVar2;
  Error EVar3;
  Error EVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  
  pCVar1 = emitter->_code;
  uVar6 = (ulong)(labelId - 0x100);
  uVar2 = (pCVar1->_labels).super_ZoneVectorBase._length;
  if (uVar6 < uVar2) {
    lVar7 = *(long *)((long)(pCVar1->_labels).super_ZoneVectorBase._data + uVar6 * 8);
  }
  else {
    lVar7 = 0;
  }
  if (lVar7 == 0) {
    pcVar8 = "InvalidLabel[Id=%u]";
    uVar6 = (ulong)labelId;
LAB_0011621a:
    EVar3 = StringBuilder::appendFormat(sb,pcVar8,uVar6);
    return EVar3;
  }
  if (*(int *)(lVar7 + 0x30) == 0) {
    pcVar8 = "L%u";
    goto LAB_0011621a;
  }
  if (*(int *)(lVar7 + 0x14) == 0) goto LAB_001162c3;
  uVar6 = (ulong)(*(int *)(lVar7 + 0x14) - 0x100);
  if (uVar6 < uVar2) {
    lVar5 = *(long *)((long)(pCVar1->_labels).super_ZoneVectorBase._data + uVar6 * 8);
  }
  else {
    lVar5 = 0;
  }
  if (lVar5 == 0) {
    pcVar8 = "InvalidLabel[Id=%u]";
    uVar6 = (ulong)labelId;
LAB_00116296:
    bVar9 = false;
    EVar3 = StringBuilder::appendFormat(sb,pcVar8,uVar6);
    if (EVar3 == 0) {
LAB_001162a3:
      EVar4 = StringBuilder::_opChar(sb,1,'.');
      bVar9 = EVar4 == 0;
      if (!bVar9) {
        EVar3 = EVar4;
      }
    }
  }
  else {
    if (*(uint *)(lVar5 + 0x30) == 0) {
      pcVar8 = "L%u";
      goto LAB_00116296;
    }
    if (*(uint *)(lVar5 + 0x30) < 0xc) {
      pcVar8 = (char *)(lVar5 + 0x34);
    }
    else {
      pcVar8 = *(char **)(lVar5 + 0x38);
    }
    EVar3 = StringBuilder::_opString(sb,1,pcVar8,0xffffffffffffffff);
    if (EVar3 == 0) goto LAB_001162a3;
    bVar9 = false;
  }
  if (!bVar9) {
    return EVar3;
  }
LAB_001162c3:
  if (*(uint *)(lVar7 + 0x30) < 0xc) {
    pcVar8 = (char *)(lVar7 + 0x34);
  }
  else {
    pcVar8 = *(char **)(lVar7 + 0x38);
  }
  EVar3 = StringBuilder::_opString(sb,1,pcVar8,0xffffffffffffffff);
  return EVar3;
}

Assistant:

Error Logging::formatLabel(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t labelId) noexcept {

  const LabelEntry* le = emitter->getCode()->getLabelEntry(labelId);
  if (ASMJIT_UNLIKELY(!le))
    return sb.appendFormat("InvalidLabel[Id=%u]", static_cast<unsigned int>(labelId));

  if (le->hasName()) {
    if (le->hasParent()) {
      uint32_t parentId = le->getParentId();
      const LabelEntry* pe = emitter->getCode()->getLabelEntry(parentId);

      if (ASMJIT_UNLIKELY(!pe))
        ASMJIT_PROPAGATE(sb.appendFormat("InvalidLabel[Id=%u]", static_cast<unsigned int>(labelId)));
      else if (ASMJIT_UNLIKELY(!pe->hasName()))
        ASMJIT_PROPAGATE(sb.appendFormat("L%u", Operand::unpackId(parentId)));
      else
        ASMJIT_PROPAGATE(sb.appendString(pe->getName()));

      ASMJIT_PROPAGATE(sb.appendChar('.'));
    }
    return sb.appendString(le->getName());
  }
  else {
    return sb.appendFormat("L%u", Operand::unpackId(labelId));
  }
}